

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYReader::readData(PLYReader *this)

{
  ulong uVar1;
  size_type sVar2;
  streambuf *in_RDI;
  PLYElement *unaff_retaddr;
  size_t i;
  streambuf *sb;
  ulong local_18;
  streambuf *in;
  
  in = in_RDI;
  uVar1 = std::ifstream::is_open();
  if ((uVar1 & 1) != 0) {
    std::ifstream::rdbuf();
    for (local_18 = 0;
        sVar2 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           (in_RDI + 0x228)), local_18 < sVar2; local_18 = local_18 + 1) {
      std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)(in_RDI + 0x228),
                 local_18);
      PLYElement::readData(unaff_retaddr,in);
    }
    std::ifstream::close();
  }
  return;
}

Assistant:

void PLYReader::readData()
{
  if (in.is_open())
  {
    std::streambuf *sb=in.rdbuf();

    for (size_t i=0; i<list.size(); i++)
    {
      list[i]->readData(sb);
    }

    in.close();
  }
}